

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O2

int run_test_udp_ref3(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_buf_t buf;
  sockaddr_in addr;
  uv_udp_t h;
  uv_udp_send_t req;
  
  buf = (uv_buf_t)uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    uv_udp_init(uVar2,&h);
    uv_udp_send(&req,&h,&buf,1,&addr,req_cb);
    uv_unref(&h);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (req_cb_called == 1) {
      do_close(&h);
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0x157;
    }
    else {
      pcVar3 = "req_cb_called == 1";
      uVar2 = 0x154;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar2 = 0x14a;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-ref.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_ref3) {
  struct sockaddr_in addr;
  uv_buf_t buf = uv_buf_init("PING", 4);
  uv_udp_send_t req;
  uv_udp_t h;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_udp_init(uv_default_loop(), &h);
  uv_udp_send(&req,
              &h,
              &buf,
              1,
              (const struct sockaddr*) &addr,
              (uv_udp_send_cb) req_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(req_cb_called == 1);
  do_close(&h);

  MAKE_VALGRIND_HAPPY();
  return 0;
}